

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.h
# Opt level: O0

void __thiscall cmFileCopier::MatchRule::MatchRule(MatchRule *this,string *regex)

{
  string *regex_local;
  MatchRule *this_local;
  
  cmsys::RegularExpression::RegularExpression(&this->Regex,regex);
  MatchProperties::MatchProperties(&this->Properties);
  std::__cxx11::string::string((string *)&this->RegexString,(string *)regex);
  return;
}

Assistant:

MatchRule(std::string const& regex)
      : Regex(regex)
      , RegexString(regex)
    {
    }